

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FsmCollection.hpp
# Opt level: O0

vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
* __thiscall
peach::fsm::FsmCollection::tokenizeText
          (vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
           *__return_storage_ptr__,FsmCollection *this,string *text,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *reservedKeywords)

{
  anon_class_16_2_551b5595 __f;
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  reference this_00;
  pointer pTVar4;
  string local_f8;
  tokenCategory_t *local_d8;
  type *category;
  type *keyword;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_c0;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *token;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  *__range2;
  undefined1 auStack_40 [8];
  anon_class_16_2_551b5595 processChar;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *reservedKeywords_local;
  string *text_local;
  FsmCollection *this_local;
  vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
  *tokens;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    processChar.tokens._7_1_ = 0;
    std::
    vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    ::vector(__return_storage_ptr__);
    auStack_40 = (undefined1  [8])this;
    processChar.this = (FsmCollection *)__return_storage_ptr__;
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __f.tokens = (vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
                  *)processChar.this;
    __f.this = (FsmCollection *)auStack_40;
    std::
    for_each<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,peach::fsm::FsmCollection::tokenizeText(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>const&)::_lambda(char)_1_>
              (__first,__last,__f);
    tokenizeText::anon_class_16_2_551b5595::operator()((anon_class_16_2_551b5595 *)auStack_40,'\0');
    __end2 = std::
             vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             ::begin(__return_storage_ptr__);
    token = (unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *)
            std::
            vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
            ::end(__return_storage_ptr__);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_*,_std::vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>_>
                                       *)&token), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_*,_std::vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>_>
                ::operator*(&__end2);
      __end3 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::begin(reservedKeywords);
      local_c0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::end(reservedKeywords);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&local_c0), bVar1) {
        keyword = &__gnu_cxx::
                   __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                   ::operator*(&__end3)->first;
        category = (type *)std::get<0ul,std::__cxx11::string,unsigned_long>
                                     ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                       *)keyword);
        local_d8 = std::get<1ul,std::__cxx11::string,unsigned_long>
                             ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                               *)keyword);
        pTVar4 = std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>::
                 operator->(this_00);
        peach::token::Token::getTokenString_abi_cxx11_(&local_f8,pTVar4);
        _Var2 = std::operator==(&local_f8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )category);
        std::__cxx11::string::~string((string *)&local_f8);
        if (_Var2) {
          pTVar4 = std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>::
                   operator->(this_00);
          peach::token::Token::setCategory(pTVar4,*local_d8);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_*,_std::vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<token::Token>> tokenizeText(const std::string &text,
                                                            const std::vector<std::pair<std::string, token::tokenCategory_t>> &reservedKeywords)
    {
        if (text.empty())
        {
            return {};
        }
        std::vector<std::unique_ptr<token::Token>> tokens;
        auto processChar = [&](char c) {
            pushNextChar(c, tokens);
        };
        std::for_each(text.begin(), text.end(), processChar);
        processChar('\0');
        for (const auto &token : tokens)
        {
            for (const auto &[keyword, category] : reservedKeywords)
            {
                if (token->getTokenString() == keyword)
                {
                    token->setCategory(category);
                }
            }
        }
        return tokens;
    }